

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O0

void duckdb::LeastGreatestFunction<long,duckdb::LessThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  long lVar1;
  VectorType VVar2;
  bool bVar3;
  idx_t iVar4;
  Vector *pVVar5;
  reference pvVar6;
  Vector *pVVar7;
  long *plVar8;
  bool *pbVar9;
  ExpressionState *pEVar10;
  Vector *in_RDX;
  ExpressionState *in_RSI;
  DataChunk *in_RDI;
  long ivalue_1;
  idx_t vindex_1;
  idx_t i_1;
  long ivalue;
  idx_t vindex;
  idx_t i;
  long *input_data;
  UnifiedVectorFormat vdata;
  idx_t col_idx_1;
  bool result_has_value [2048];
  long *result_data;
  idx_t col_idx;
  VectorType result_type;
  Vector *result_vector;
  DataChunk *input;
  long *in_stack_fffffffffffff6d8;
  undefined7 in_stack_fffffffffffff6e0;
  undefined1 in_stack_fffffffffffff6e7;
  ExpressionState *in_stack_fffffffffffff6e8;
  undefined6 in_stack_fffffffffffff6f0;
  undefined1 in_stack_fffffffffffff6f6;
  undefined1 in_stack_fffffffffffff6f7;
  bool *in_stack_fffffffffffff6f8;
  reference in_stack_fffffffffffff700;
  Vector *this;
  Vector *in_stack_fffffffffffff728;
  Vector *in_stack_fffffffffffff730;
  ExpressionState *idx;
  bool *local_8b8;
  SelectionVector *local_898;
  TemplatedValidityMask<unsigned_long> local_888;
  UnifiedVectorFormat *in_stack_fffffffffffff7a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffff7a8;
  Vector *this_00;
  bool local_848 [2056];
  long *local_40;
  Vector *local_38;
  undefined1 local_29;
  Vector *local_28;
  DataChunk *local_20;
  Vector *local_18;
  ExpressionState *local_10;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar4 = DataChunk::ColumnCount((DataChunk *)0x200d4fc);
  if (iVar4 == 1) {
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)
               CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
               (size_type)in_stack_fffffffffffff6d8);
    Vector::Reference(in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  }
  else {
    local_20 = StandardLeastGreatest<false>::Prepare(local_8,local_10);
    local_28 = StandardLeastGreatest<false>::TargetVector(local_18,local_10);
    local_29 = 2;
    local_38 = (Vector *)0x0;
    while (this = local_38, pVVar5 = (Vector *)DataChunk::ColumnCount((DataChunk *)0x200d59a),
          this < pVVar5) {
      pvVar6 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)
                          CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
                          (size_type)in_stack_fffffffffffff6d8);
      VVar2 = Vector::GetVectorType(pvVar6);
      if (VVar2 != CONSTANT_VECTOR) {
        local_29 = 0;
      }
      local_38 = (Vector *)&local_38->field_0x1;
    }
    local_40 = FlatVector::GetData<long>((Vector *)0x200d5f5);
    memset(local_848,0,0x800);
    pVVar5 = (Vector *)0x0;
    while (this_00 = pVVar5, pVVar7 = (Vector *)DataChunk::ColumnCount((DataChunk *)0x200d637),
          pVVar5 < pVVar7) {
      pvVar6 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)
                          CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
                          (size_type)in_stack_fffffffffffff6d8);
      VVar2 = Vector::GetVectorType(pvVar6);
      if (VVar2 == CONSTANT_VECTOR) {
        vector<duckdb::Vector,_true>::operator[]
                  ((vector<duckdb::Vector,_true> *)
                   CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
                   (size_type)in_stack_fffffffffffff6d8);
        bVar3 = ConstantVector::IsNull((Vector *)0x200d686);
        if (!bVar3) goto LAB_0200d691;
      }
      else {
LAB_0200d691:
        UnifiedVectorFormat::UnifiedVectorFormat
                  ((UnifiedVectorFormat *)
                   CONCAT17(in_stack_fffffffffffff6f7,
                            CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)));
        in_stack_fffffffffffff700 =
             vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)
                        CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
                        (size_type)in_stack_fffffffffffff6d8);
        DataChunk::size(local_20);
        Vector::ToUnifiedFormat
                  (this_00,(idx_t)in_stack_fffffffffffff7a8._M_pi,in_stack_fffffffffffff7a0);
        plVar8 = UnifiedVectorFormat::GetData<long>((UnifiedVectorFormat *)&local_898);
        bVar3 = TemplatedValidityMask<unsigned_long>::AllValid(&local_888);
        if (bVar3) {
          in_stack_fffffffffffff6e8 = (ExpressionState *)0x0;
          while (idx = in_stack_fffffffffffff6e8,
                pEVar10 = (ExpressionState *)DataChunk::size(local_20),
                in_stack_fffffffffffff6e8 < pEVar10) {
            iVar4 = SelectionVector::get_index(local_898,(idx_t)idx);
            lVar1 = plVar8[iVar4];
            if (((local_848[(long)idx] & 1U) == 0) ||
               (in_stack_fffffffffffff6e7 =
                     LessThan::Operation<long>
                               ((long *)CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0
                                                ),in_stack_fffffffffffff6d8),
               (bool)in_stack_fffffffffffff6e7)) {
              local_848[(long)idx] = true;
              local_40[(long)idx] = lVar1;
            }
            in_stack_fffffffffffff6e8 = (ExpressionState *)((long)&idx->_vptr_ExpressionState + 1);
          }
        }
        else {
          local_8b8 = (bool *)0x0;
          while (in_stack_fffffffffffff6f8 = local_8b8, pbVar9 = (bool *)DataChunk::size(local_20),
                in_stack_fffffffffffff6f8 < pbVar9) {
            iVar4 = SelectionVector::get_index(local_898,(idx_t)local_8b8);
            in_stack_fffffffffffff6f7 =
                 TemplatedValidityMask<unsigned_long>::RowIsValid
                           ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffff6e8,
                            CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0));
            if (((bool)in_stack_fffffffffffff6f7) &&
               ((lVar1 = plVar8[iVar4], (local_848[(long)local_8b8] & 1U) == 0 ||
                (in_stack_fffffffffffff6f6 =
                      LessThan::Operation<long>
                                ((long *)CONCAT17(in_stack_fffffffffffff6e7,
                                                  in_stack_fffffffffffff6e0),
                                 in_stack_fffffffffffff6d8), (bool)in_stack_fffffffffffff6f6)))) {
              local_848[(long)local_8b8] = true;
              local_40[(long)local_8b8] = lVar1;
            }
            local_8b8 = local_8b8 + 1;
          }
        }
        UnifiedVectorFormat::~UnifiedVectorFormat
                  ((UnifiedVectorFormat *)
                   CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0));
      }
      pVVar5 = (Vector *)&this_00->field_0x1;
    }
    DataChunk::size(local_20);
    VVar2 = (VectorType)((ulong)pVVar5 >> 0x38);
    StandardLeastGreatest<false>::FinalizeResult
              ((idx_t)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,
               (Vector *)
               CONCAT17(in_stack_fffffffffffff6f7,
                        CONCAT16(in_stack_fffffffffffff6f6,in_stack_fffffffffffff6f0)),
               in_stack_fffffffffffff6e8);
    Vector::SetVectorType(this,VVar2);
  }
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}